

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O1

int __thiscall Fl_Group::handle(Fl_Group *this,int event)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  uint *puVar4;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  size_t __n_03;
  size_t __n_04;
  size_t __n_05;
  size_t extraout_RDX_00;
  size_t __n_06;
  size_t __n_07;
  int j;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 *__buf;
  Fl_Widget *pFVar8;
  Fl_Widget ***pppFVar9;
  ulong uVar10;
  void *__buf_00;
  bool bVar11;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_40;
  void *local_38;
  
  __buf_00 = (void *)(ulong)(uint)event;
  iVar1 = this->children_;
  uVar10 = (ulong)iVar1;
  if ((long)uVar10 < 2) {
    pppFVar9 = &this->array_;
  }
  else {
    pppFVar9 = (Fl_Widget ***)this->array_;
  }
  puVar4 = &switchD_001ae3f6::switchdataD_0021b9d8;
  switch(event) {
  case 1:
    if (iVar1 != 0) {
      do {
        pFVar8 = (Fl_Widget *)pppFVar9[uVar10 - 1];
        if (((pFVar8->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 != 0)) {
          Fl_Widget_Tracker::Fl_Widget_Tracker(&local_40,pFVar8);
          sVar3 = send((int)pFVar8,&DAT_00000001,__n_03,(int)puVar4);
          if ((int)sVar3 != 0) {
            if (((Fl::pushed_ != (Fl_Widget *)0x0) && (local_40.wp_ != (Fl_Widget *)0x0)) &&
               (iVar1 = Fl_Widget::contains(pFVar8,Fl::pushed_), iVar1 == 0)) {
              Fl::pushed(pFVar8);
            }
            Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_40);
            return 1;
          }
          Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_40);
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    break;
  case 2:
  case 5:
    if ((Fl_Group *)Fl::pushed_ != this) {
      if (Fl::pushed_ != (Fl_Widget *)0x0) {
        send((int)Fl::pushed_,__buf_00,in_RDX,0x21b9d8);
        return 0;
      }
      if (iVar1 != 0) {
        while (((pFVar8 = (Fl_Widget *)pppFVar9[uVar10 - 1], (pFVar8->flags_ & 7) != 0 ||
                (iVar1 = Fl::event_inside(pFVar8), iVar1 == 0)) ||
               (sVar3 = send((int)pFVar8,__buf_00,__n_06,(int)puVar4), (int)sVar3 == 0))) {
          uVar10 = uVar10 - 1;
          if (uVar10 == 0) {
            return 0;
          }
        }
        return 1;
      }
      return 0;
    }
    break;
  case 3:
  case 0xb:
    if (iVar1 != 0) {
      do {
        pFVar8 = (Fl_Widget *)pppFVar9[uVar10 - 1];
        if (((pFVar8->flags_ & 2) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 != 0)) {
          iVar1 = Fl_Widget::contains(pFVar8,Fl::belowmouse_);
          iVar2 = (int)puVar4;
          if (iVar1 != 0) {
            __buf = &DAT_0000000b;
            __n_07 = extraout_RDX;
LAB_001ae88b:
            sVar3 = send((int)pFVar8,__buf,__n_07,iVar2);
            return (int)sVar3;
          }
          Fl::belowmouse(pFVar8);
          sVar3 = send((int)pFVar8,&DAT_00000003,__n,(int)puVar4);
          if ((int)sVar3 != 0) {
            return 1;
          }
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    Fl::belowmouse(&this->super_Fl_Widget);
    return 1;
  default:
    uVar7 = 0;
    if (0 < iVar1) {
      uVar7 = 0;
      do {
        if (Fl::focus_ == (Fl_Widget *)pppFVar9[uVar7]) goto LAB_001ae7f5;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
      uVar7 = 0;
    }
LAB_001ae7f5:
    if (iVar1 == 0) {
      return 0;
    }
    uVar10 = uVar7 & 0xffffffff;
    do {
      if (((((Fl_Widget *)pppFVar9[(int)uVar10])->flags_ & 7) == 0) &&
         (sVar3 = send((int)(Fl_Widget *)pppFVar9[(int)uVar10],__buf_00,in_RDX,(int)puVar4),
         in_RDX = extraout_RDX_00, (int)sVar3 != 0)) {
        return 1;
      }
      uVar5 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar5;
      if (this->children_ <= (int)uVar5) {
        uVar10 = 0;
      }
    } while ((int)uVar10 != (int)uVar7);
    return 0;
  case 6:
    iVar1 = navkey();
    if (iVar1 - 0xff51U < 2) {
      while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
        iVar1 = Fl_Widget::take_focus((Fl_Widget *)pppFVar9[uVar10]);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    else {
      if (((1 < iVar1 - 0xff53U) && (this->savedfocus_ != (Fl_Widget *)0x0)) &&
         (iVar1 = Fl_Widget::take_focus(this->savedfocus_), iVar1 != 0)) {
        return 1;
      }
      iVar1 = this->children_;
      lVar6 = 0;
      while (iVar1 != (int)lVar6) {
        iVar2 = Fl_Widget::take_focus((Fl_Widget *)pppFVar9[lVar6]);
        lVar6 = lVar6 + 1;
        if (iVar2 != 0) {
          return 1;
        }
      }
    }
    break;
  case 7:
    this->savedfocus_ = fl_oldfocus;
    break;
  case 8:
    iVar1 = navkey();
LAB_001ae7a7:
    iVar1 = navigation(this,iVar1);
    return iVar1;
  case 0xc:
    if (iVar1 != 0) {
      do {
        pFVar8 = (Fl_Widget *)pppFVar9[uVar10 - 1];
        if ((((pFVar8->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 != 0)) &&
           (sVar3 = send((int)pFVar8,&DAT_0000000c,__n_04,(int)puVar4), (int)sVar3 != 0)) {
          return 1;
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    for (lVar6 = (long)this->children_; lVar6 != 0; lVar6 = lVar6 + -1) {
      pFVar8 = (Fl_Widget *)pppFVar9[lVar6 + -1];
      if ((((pFVar8->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 == 0)) &&
         (sVar3 = send((int)pFVar8,&DAT_0000000c,__n_05,(int)puVar4), (int)sVar3 != 0)) {
        return 1;
      }
    }
    if ((Fl::e_keysym | 0x80U) == 0xff8d) {
      iVar1 = 0xff54;
      goto LAB_001ae7a7;
    }
    break;
  case 0xd:
  case 0xe:
    if (iVar1 == 0) {
      return 1;
    }
    lVar6 = 0;
    do {
      pFVar8 = (Fl_Widget *)pppFVar9[lVar6];
      if ((pFVar8->flags_ & 1) == 0) {
        (*pFVar8->_vptr_Fl_Widget[3])(pFVar8,__buf_00);
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != (int)lVar6);
    return 1;
  case 0xf:
  case 0x10:
    if (iVar1 != 0) {
      lVar6 = 0;
      local_38 = __buf_00;
      do {
        iVar2 = Fl::e_number;
        pFVar8 = (Fl_Widget *)pppFVar9[lVar6];
        if (((int)__buf_00 == 0xf) && (pFVar8 == Fl::focus_)) {
          Fl::e_number = 7;
          (*pFVar8->_vptr_Fl_Widget[3])(pFVar8,7);
          __buf_00 = local_38;
          Fl::e_number = iVar2;
          Fl::focus((Fl_Widget *)0x0);
        }
        if ((pFVar8->flags_ & 2) == 0) {
          (*pFVar8->_vptr_Fl_Widget[3])(pFVar8,(ulong)__buf_00 & 0xffffffff);
        }
        lVar6 = lVar6 + 1;
      } while (iVar1 != (int)lVar6);
      return 1;
    }
    return 1;
  case 0x13:
    if (iVar1 != 0) {
      do {
        pFVar8 = (Fl_Widget *)pppFVar9[uVar10 - 1];
        if ((((pFVar8->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 != 0)) &&
           (sVar3 = send((int)pFVar8,(void *)0x13,__n_01,(int)puVar4), (int)sVar3 != 0)) {
          return 1;
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    for (lVar6 = (long)this->children_; lVar6 != 0; lVar6 = lVar6 + -1) {
      pFVar8 = (Fl_Widget *)pppFVar9[lVar6 + -1];
      if ((((pFVar8->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 == 0)) &&
         (sVar3 = send((int)pFVar8,(void *)0x13,__n_02,(int)puVar4), (int)sVar3 != 0)) {
        return 1;
      }
    }
    break;
  case 0x14:
  case 0x15:
    if (iVar1 != 0) {
      do {
        pFVar8 = (Fl_Widget *)pppFVar9[uVar10 - 1];
        if (((pFVar8->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar8), iVar1 != 0)) {
          iVar1 = Fl_Widget::contains(pFVar8,Fl::belowmouse_);
          iVar2 = (int)puVar4;
          if (iVar1 != 0) {
            __buf = &DAT_00000015;
            __n_07 = __n_00;
            goto LAB_001ae88b;
          }
          sVar3 = send((int)pFVar8,&DAT_00000014,__n_00,iVar2);
          if ((int)sVar3 != 0) {
            iVar1 = Fl_Widget::contains(pFVar8,Fl::belowmouse_);
            if (iVar1 == 0) {
              Fl::belowmouse(pFVar8);
              return 1;
            }
            return 1;
          }
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    Fl::belowmouse(&this->super_Fl_Widget);
  }
  return 0;
}

Assistant:

int Fl_Group::handle(int event) {

  Fl_Widget*const* a = array();
  int i;
  Fl_Widget* o;

  switch (event) {

  case FL_FOCUS:
    switch (navkey()) {
    default:
      if (savedfocus_ && savedfocus_->take_focus()) return 1;
    case FL_Right:
    case FL_Down:
      for (i = children(); i--;) if ((*a++)->take_focus()) return 1;
      break;
    case FL_Left:
    case FL_Up:
      for (i = children(); i--;) if (a[i]->take_focus()) return 1;
      break;
    }
    return 0;

  case FL_UNFOCUS:
    savedfocus_ = fl_oldfocus;
    return 0;

  case FL_KEYBOARD:
    return navigation(navkey());

  case FL_SHORTCUT:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o) && send(o,FL_SHORTCUT))
	return 1;
    }
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && !Fl::event_inside(o) && send(o,FL_SHORTCUT))
	return 1;
    }
    if ((Fl::event_key() == FL_Enter || Fl::event_key() == FL_KP_Enter)) return navigation(FL_Down);
    return 0;

  case FL_ENTER:
  case FL_MOVE:
    for (i = children(); i--;) {
      o = a[i];
      if (o->visible() && Fl::event_inside(o)) {
	if (o->contains(Fl::belowmouse())) {
	  return send(o,FL_MOVE);
	} else {
	  Fl::belowmouse(o);
	  if (send(o,FL_ENTER)) return 1;
	}
      }
    }
    Fl::belowmouse(this);
    return 1;

  case FL_DND_ENTER:
  case FL_DND_DRAG:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o)) {
	if (o->contains(Fl::belowmouse())) {
	  return send(o,FL_DND_DRAG);
	} else if (send(o,FL_DND_ENTER)) {
	  if (!o->contains(Fl::belowmouse())) Fl::belowmouse(o);
	  return 1;
	}
      }
    }
    Fl::belowmouse(this);
    return 0;

  case FL_PUSH:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o)) {
	Fl_Widget_Tracker wp(o);
	if (send(o,FL_PUSH)) {
	  if (Fl::pushed() && wp.exists() && !o->contains(Fl::pushed())) Fl::pushed(o);
	  return 1;
	}
      }
    }
    return 0;

  case FL_RELEASE:
  case FL_DRAG:
    o = Fl::pushed();
    if (o == this) return 0;
    else if (o) send(o,event);
    else {
      for (i = children(); i--;) {
	o = a[i];
	if (o->takesevents() && Fl::event_inside(o)) {
	  if (send(o,event)) return 1;
	}
      }
    }
    return 0;

  case FL_MOUSEWHEEL:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o) && send(o,FL_MOUSEWHEEL))
	return 1;
    }
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && !Fl::event_inside(o) && send(o,FL_MOUSEWHEEL))
	return 1;
    }
    return 0;

  case FL_DEACTIVATE:
  case FL_ACTIVATE:
    for (i = children(); i--;) {
      o = *a++;
      if (o->active()) o->handle(event);
    }
    return 1;

  case FL_SHOW:
  case FL_HIDE:
    for (i = children(); i--;) {
      o = *a++;
      if (event == FL_HIDE && o == Fl::focus()) {
        // Give up input focus...
	int old_event = Fl::e_number;
        o->handle(Fl::e_number = FL_UNFOCUS);
	Fl::e_number = old_event;
	Fl::focus(0);
      }
      if (o->visible()) o->handle(event);
    }
    return 1;

  default:
    // For all other events, try to give to each child, starting at focus:
    for (i = 0; i < children(); i ++)
      if (Fl::focus_ == a[i]) break;

    if (i >= children()) i = 0;

    if (children()) {
      for (int j = i;;) {
        if (a[j]->takesevents()) if (send(a[j], event)) return 1;
        j++;
        if (j >= children()) j = 0;
        if (j == i) break;
      }
    }

    return 0;
  }
}